

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtosc.c
# Opt level: O3

size_t rtosc_vmessage(char *buffer,size_t len,char *address,char *arguments,__va_list_tag *ap)

{
  uint uVar1;
  size_t sVar2;
  ulong nargs;
  rtosc_arg_t *args;
  undefined8 uStack_60;
  undefined1 auStack_58 [8];
  rtosc_va_list_t ap2;
  
  uStack_60 = 0x110d28;
  uVar1 = nreserved(arguments);
  if (uVar1 != 0) {
    nargs = (ulong)uVar1;
    args = (rtosc_arg_t *)((long)&ap2 + nargs * -0x10 + -8);
    ap2.a[0].overflow_arg_area = ap->reg_save_area;
    auStack_58._0_4_ = ap->gp_offset;
    auStack_58._4_4_ = ap->fp_offset;
    ap2.a[0]._0_8_ = ap->overflow_arg_area;
    ap2.a[0].reg_save_area = auStack_58;
    (&uStack_60)[nargs * -2] = 0x110d65;
    rtosc_v2args(args,nargs,arguments,(rtosc_va_list_t *)auStack_58);
    (&uStack_60)[nargs * -2] = 0x110d7a;
    sVar2 = rtosc_amessage(buffer,len,address,arguments,args);
    return sVar2;
  }
  sVar2 = rtosc_amessage(buffer,len,address,arguments,(rtosc_arg_t *)0x0);
  return sVar2;
}

Assistant:

size_t rtosc_vmessage(char       *buffer,
                      size_t      len,
                      const char *address,
                      const char *arguments,
                      va_list     ap)
{
    const unsigned nargs = nreserved(arguments);
    if(!nargs)
        return rtosc_amessage(buffer,len,address,arguments,NULL);

    STACKALLOC(rtosc_arg_t, args, nargs);
    rtosc_va_list_t ap2;
    va_copy(ap2.a, ap);
    rtosc_v2args(args, nargs, arguments, &ap2);

    return rtosc_amessage(buffer,len,address,arguments,args);
}